

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O2

void CoreML::Specification::CoreMLModels::protobuf_VisionFeaturePrint_2eproto::TableStruct::
     InitDefaultsImpl(void)

{
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/VisionFeaturePrint.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  VisionFeaturePrint_Scene::VisionFeaturePrint_Scene
            ((VisionFeaturePrint_Scene *)&_VisionFeaturePrint_Scene_default_instance_);
  DAT_003527d0 = 1;
  VisionFeaturePrint_Objects::VisionFeaturePrint_Objects
            ((VisionFeaturePrint_Objects *)&_VisionFeaturePrint_Objects_default_instance_);
  DAT_00352808 = 1;
  VisionFeaturePrint::VisionFeaturePrint
            ((VisionFeaturePrint *)&_VisionFeaturePrint_default_instance_);
  DAT_00352830 = 1;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  _VisionFeaturePrint_Scene_default_instance_.DefaultConstruct();
  _VisionFeaturePrint_Objects_default_instance_.DefaultConstruct();
  _VisionFeaturePrint_default_instance_.DefaultConstruct();
}